

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
Clear<google::protobuf::RepeatedPtrField<CoreML::Specification::Model>::TypeHandler>
          (RepeatedPtrFieldBase *this)

{
  uint uVar1;
  Rep *pRVar2;
  Model *this_00;
  LogMessage *other;
  ulong uVar3;
  LogFinisher local_69;
  LogMessage local_68;
  
  uVar1 = this->current_size_;
  if ((int)uVar1 < 0) {
    LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x60a);
    other = LogMessage::operator<<(&local_68,"CHECK failed: (n) >= (0): ");
    LogFinisher::operator=(&local_69,other);
    LogMessage::~LogMessage(&local_68);
  }
  else if ((ulong)uVar1 != 0) {
    pRVar2 = this->rep_;
    uVar3 = 0;
    do {
      this_00 = (Model *)pRVar2->elements[uVar3];
      if (this_00->description_ != (ModelDescription *)0x0) {
        (*(this_00->description_->super_MessageLite)._vptr_MessageLite[1])();
      }
      uVar3 = uVar3 + 1;
      *(undefined8 *)((long)&this_00->description_ + 5) = 0;
      this_00->description_ = (ModelDescription *)0x0;
      CoreML::Specification::Model::clear_Type(this_00);
    } while (uVar1 != uVar3);
    this->current_size_ = 0;
  }
  return;
}

Assistant:

void RepeatedPtrFieldBase::Clear() {
  const int n = current_size_;
  GOOGLE_DCHECK_GE(n, 0);
  if (n > 0) {
    void* const* elements = rep_->elements;
    int i = 0;
    do {
      TypeHandler::Clear(cast<TypeHandler>(elements[i++]));
    } while (i < n);
    current_size_ = 0;
  }
}